

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

IReporter *
doctest::detail::reporterCreator<doctest::(anonymous_namespace)::XmlReporter>(ContextOptions *o)

{
  IReporter *pIVar1;
  
  pIVar1 = (IReporter *)operator_new(0x88);
  pIVar1->_vptr_IReporter = (_func_int **)&PTR_report_query_00137498;
  anon_unknown_14::XmlWriter::XmlWriter((XmlWriter *)(pIVar1 + 1),o->cout);
  pIVar1[0xc]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xd]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[10]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xb]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xe]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xf]._vptr_IReporter = (_func_int **)o;
  pIVar1[0x10]._vptr_IReporter = (_func_int **)0x0;
  return pIVar1;
}

Assistant:

IReporter* reporterCreator(const ContextOptions& o) {
        return new Reporter(o);
    }